

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  uint uVar1;
  bool bVar2;
  Message *pMVar3;
  uint uVar4;
  bool bVar5;
  undefined1 local_80 [8];
  string error_message;
  string local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  Message buffer;
  
  if (this->spawned_ != true) {
    return false;
  }
  GetCapturedStderr_abi_cxx11_();
  Message::Message((Message *)&local_20);
  std::operator<<((ostream *)(local_20.ptr_ + 0x10),"Death test: ");
  local_40._M_dataplus._M_p = this->statement_;
  pMVar3 = Message::operator<<((Message *)&local_20,(char **)&local_40);
  Message::operator<<(pMVar3,(char (*) [2])0x12c114);
  switch(this->outcome_) {
  case DIED:
    if (status_ok) {
      bVar2 = RE::PartialMatch((char *)local_80,this->regex_);
      bVar5 = true;
      if (bVar2) goto LAB_0011ebb1;
      std::operator<<((ostream *)(local_20.ptr_ + 0x10),
                      "    Result: died but not with expected error.\n");
      std::operator<<((ostream *)(local_20.ptr_ + 0x10),"  Expected: ");
      error_message.field_2._8_8_ = *(undefined8 *)this->regex_;
      pMVar3 = Message::operator<<((Message *)&local_20,(char **)((long)&error_message.field_2 + 8))
      ;
      pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x12c114);
      pMVar3 = Message::operator<<(pMVar3,(char (*) [13])"Actual msg:\n");
      FormatDeathTestOutput(&local_40,(string *)local_80);
      Message::operator<<(pMVar3,&local_40);
    }
    else {
      std::operator<<((ostream *)(local_20.ptr_ + 0x10),
                      "    Result: died but not with expected exit code:\n");
      std::operator<<((ostream *)(local_20.ptr_ + 0x10),"            ");
      uVar1 = this->status_;
      Message::Message((Message *)((long)&error_message.field_2 + 8));
      uVar4 = uVar1 & 0x7f;
      if (uVar4 == 0) {
        std::operator<<((ostream *)(error_message.field_2._8_8_ + 0x10),"Exited with exit status ");
        std::ostream::operator<<((void *)(error_message.field_2._8_8_ + 0x10),uVar1 >> 8 & 0xff);
      }
      else if (0x1ffffff < (int)(uVar4 * 0x1000000 + 0x1000000)) {
        std::operator<<((ostream *)(error_message.field_2._8_8_ + 0x10),"Terminated by signal ");
        std::ostream::operator<<((void *)(error_message.field_2._8_8_ + 0x10),uVar4);
      }
      if ((char)uVar1 < '\0') {
        std::operator<<((ostream *)(error_message.field_2._8_8_ + 0x10)," (core dumped)");
      }
      StringStreamToString(&local_40,(stringstream *)error_message.field_2._8_8_);
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)((long)&error_message.field_2 + 8));
      std::operator<<((ostream *)(local_20.ptr_ + 0x10),(string *)&local_40);
      std::operator<<((ostream *)(local_20.ptr_ + 0x10),"\n");
      std::operator<<((ostream *)(local_20.ptr_ + 0x10),"Actual msg:\n");
      FormatDeathTestOutput((string *)((long)&error_message.field_2 + 8),(string *)local_80);
      std::operator<<((ostream *)(local_20.ptr_ + 0x10),
                      (string *)(error_message.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(error_message.field_2._M_local_buf + 8));
    }
    break;
  case LIVED:
    std::operator<<((ostream *)(local_20.ptr_ + 0x10),"    Result: failed to die.\n");
    std::operator<<((ostream *)(local_20.ptr_ + 0x10)," Error msg:\n");
    FormatDeathTestOutput(&local_40,(string *)local_80);
    std::operator<<((ostream *)(local_20.ptr_ + 0x10),(string *)&local_40);
    break;
  case RETURNED:
    std::operator<<((ostream *)(local_20.ptr_ + 0x10),
                    "    Result: illegal return in test statement.\n");
    std::operator<<((ostream *)(local_20.ptr_ + 0x10)," Error msg:\n");
    FormatDeathTestOutput(&local_40,(string *)local_80);
    std::operator<<((ostream *)(local_20.ptr_ + 0x10),(string *)&local_40);
    break;
  case THREW:
    std::operator<<((ostream *)(local_20.ptr_ + 0x10),"    Result: threw an exception.\n");
    std::operator<<((ostream *)(local_20.ptr_ + 0x10)," Error msg:\n");
    FormatDeathTestOutput(&local_40,(string *)local_80);
    std::operator<<((ostream *)(local_20.ptr_ + 0x10),(string *)&local_40);
    break;
  default:
    GTestLog::GTestLog((GTestLog *)&local_40,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/gtest/googletest/src/gtest-death-test.cc"
                       ,0x256);
    std::operator<<((ostream *)&std::cerr,
                    "DeathTest::Passed somehow called before conclusion of test");
    GTestLog::~GTestLog((GTestLog *)&local_40);
    goto LAB_0011ebae;
  }
  std::__cxx11::string::~string((string *)&local_40);
LAB_0011ebae:
  bVar5 = false;
LAB_0011ebb1:
  StringStreamToString(&local_40,local_20.ptr_);
  DeathTest::set_last_death_test_message(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_20);
  std::__cxx11::string::~string((string *)local_80);
  return bVar5;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const std::string error_message = GetCapturedStderr();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
# if GTEST_USES_PCRE
        // PCRE regexes support embedded NULs.
        // GTEST_USES_PCRE is defined only in google3 mode
        const bool matched = RE::PartialMatch(error_message, *regex());
# else
        const bool matched = RE::PartialMatch(error_message.c_str(), *regex());
# endif  // GTEST_USES_PCRE
        if (matched) {
          success = true;
        } else {
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << regex()->pattern() << "\n"
                 << "Actual msg:\n" << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n" << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}